

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O0

string * __thiscall
spvtools::opt::Operand::AsString_abi_cxx11_(string *__return_storage_ptr__,Operand *this)

{
  bool in_CL;
  Operand *this_local;
  
  if (this->type == SPV_OPERAND_TYPE_LITERAL_STRING) {
    utils::MakeString<spvtools::utils::SmallVector<unsigned_int,2ul>>
              (__return_storage_ptr__,(utils *)&this->words,(SmallVector<unsigned_int,_2UL> *)0x1,
               in_CL);
    return __return_storage_ptr__;
  }
  __assert_fail("type == SPV_OPERAND_TYPE_LITERAL_STRING",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                ,0x67,"std::string spvtools::opt::Operand::AsString() const");
}

Assistant:

std::string AsString() const {
    assert(type == SPV_OPERAND_TYPE_LITERAL_STRING);
    return spvtools::utils::MakeString(words);
  }